

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O1

int __thiscall asl::Var::length(Var *this)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = 0;
  switch(this->_type) {
  case SSTRING:
    sVar2 = strlen((this->field_1)._ss);
    return (int)sVar2;
  case STRING:
    return *(int *)((this->field_1)._l + -0x10) + -1;
  case ARRAY:
  case DIC:
    iVar1 = *(int *)((this->field_1)._l + -0x10);
  }
  return iVar1;
}

Assistant:

int Var::length() const
{
	switch(_type) {
	case ARRAY:
		return _a->length(); break;
	case OBJ:
		return _o->length(); break;
	case STRING:
		return _s->length()-1; break;
	case SSTRING:
		return (int)strlen(_ss); break;
	default:
		break;
	}
	return 0;
}